

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::ScrollArea::ensureWidgetVisible
          (ScrollArea *this,QWidget *childWidget,int xmargin,int ymargin)

{
  AbstractScrollAreaPrivate *pAVar1;
  char cVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  AbstractScrollArea *pAVar6;
  AbstractScrollArea *pAVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  QRect focusRect;
  QRect visibleRect;
  anon_union_24_3_e3d07ef4_for_data local_70;
  AbstractScrollArea *local_50;
  QRect local_48;
  QPoint local_38;
  
  pAVar1 = (this->super_AbstractScrollArea).d.d;
  cVar2 = QWidget::isAncestorOf((QWidget *)pAVar1[1].q);
  if (cVar2 != '\0') {
    local_50 = &this->super_AbstractScrollArea;
    (**(code **)(*(long *)childWidget + 400))(&local_70,childWidget,2);
    auVar9 = QVariant::toRect();
    QVariant::~QVariant((QVariant *)&local_70);
    QWidget::inputMethodQuery((InputMethodQuery)&local_70);
    auVar10 = QVariant::toRect();
    QVariant::~QVariant((QVariant *)&local_70);
    pAVar6 = local_50;
    if (((auVar10._0_8_ ^ auVar9._0_8_) >> 0x20 == 0 &&
         (auVar10._8_4_ == auVar9._8_4_ && auVar10._0_4_ == auVar9._0_4_)) &&
       ((auVar10._8_8_ ^ auVar9._8_8_) >> 0x20 == 0)) {
      if (pAVar1[1]._vptr_AbstractScrollAreaPrivate == (_func_int **)0x0) {
        pAVar7 = (AbstractScrollArea *)0x0;
      }
      else if (*(int *)((long)pAVar1[1]._vptr_AbstractScrollAreaPrivate + 4) == 0) {
        pAVar7 = (AbstractScrollArea *)0x0;
      }
      else {
        pAVar7 = pAVar1[1].q;
      }
      local_38.xp = 0;
      local_38.yp = 0;
      uVar3 = QWidget::mapTo(childWidget,(QPoint *)pAVar7);
      lVar4 = *(long *)(childWidget + 0x20);
      local_70._0_4_ = (undefined4)uVar3;
      local_70._8_4_ = (*(int *)(lVar4 + 0x1c) + local_70._0_4_) - *(int *)(lVar4 + 0x14);
      local_70._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
      local_70._12_4_ = (*(int *)(lVar4 + 0x20) + local_70._4_4_) - *(int *)(lVar4 + 0x18);
    }
    else {
      if ((pAVar1[1]._vptr_AbstractScrollAreaPrivate == (_func_int **)0x0) ||
         (*(int *)((long)pAVar1[1]._vptr_AbstractScrollAreaPrivate + 4) == 0)) {
        pAVar6 = (AbstractScrollArea *)0x0;
      }
      else {
        pAVar6 = pAVar1[1].q;
      }
      local_48._0_8_ = auVar9._0_8_;
      uVar3 = QWidget::mapTo(childWidget,(QPoint *)pAVar6);
      local_70._0_4_ = (undefined4)uVar3;
      local_70._8_4_ = (auVar9._8_4_ - auVar9._0_4_) + local_70._0_4_;
      local_70._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
      local_70._12_4_ = (auVar9._12_4_ - auVar9._4_4_) + local_70._4_4_;
      pAVar6 = local_50;
    }
    uVar3 = QWidget::pos();
    iVar8 = (int)((ulong)uVar3 >> 0x20);
    local_48.y1 = -iVar8;
    local_48.x1 = -(int)uVar3;
    lVar4 = *(long *)(pAVar1->viewport + 0x20);
    local_48.x2 = *(int *)(lVar4 + 0x1c) - ((int)uVar3 + *(int *)(lVar4 + 0x14));
    local_48.y2 = *(int *)(lVar4 + 0x20) - (iVar8 + *(int *)(lVar4 + 0x18));
    cVar2 = QRect::contains(&local_48,SUB81(&local_70,0));
    if (cVar2 == '\0') {
      local_70._0_4_ = local_70._0_4_ - xmargin;
      local_70._4_4_ = local_70._4_4_ - ymargin;
      lVar4 = (long)(int)local_70._8_4_;
      local_70._8_4_ = (undefined4)(xmargin + lVar4);
      lVar5 = (long)(int)local_70._12_4_;
      local_70._12_4_ = (undefined4)(ymargin + lVar5);
      if ((local_48.x2 - local_48.x1) + 1 < (local_70._8_4_ - local_70._0_4_) + 1) {
        lVar4 = xmargin + lVar4 + (long)(int)local_70._0_4_;
        iVar8 = *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x1c) -
                *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x14);
        local_38.xp = (int)((ulong)(lVar4 - (lVar4 >> 0x3f)) >> 1) -
                      ((iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1);
      }
      else if (local_48.x2 < (int)local_70._8_4_) {
        local_38.xp = ~*(uint *)(*(long *)(pAVar1->viewport + 0x20) + 0x1c) + local_70._8_4_ +
                      *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x14);
      }
      else {
        local_38.xp = 0;
        if ((int)local_70._0_4_ < local_48.x1) {
          local_38.xp = local_70._0_4_;
        }
      }
      if ((local_48.y2 - local_48.y1) + 1 < (local_70._12_4_ - local_70._4_4_) + 1) {
        lVar4 = ymargin + lVar5 + (long)(int)local_70._4_4_;
        iVar8 = *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x20) -
                *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x18);
        local_38.yp = (int)((ulong)(lVar4 - (lVar4 >> 0x3f)) >> 1) -
                      ((iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1);
      }
      else if (local_48.y2 < (int)local_70._12_4_) {
        local_38.yp = ~*(uint *)(*(long *)(pAVar1->viewport + 0x20) + 0x20) + local_70._12_4_ +
                      *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x18);
      }
      else {
        local_38.yp = 0;
        if ((int)local_70._4_4_ < local_48.y1) {
          local_38.yp = local_70._4_4_;
        }
      }
      AbstractScrollArea::setTopLeftPointShownArea(pAVar6,&local_38);
    }
  }
  return;
}

Assistant:

void
ScrollArea::ensureWidgetVisible( QWidget * childWidget,
	int xmargin, int ymargin )
{
	ScrollAreaPrivate * d = d_func();

	if( !d->widget->isAncestorOf( childWidget ) )
		return;

	const QRect microFocus =
		childWidget->inputMethodQuery( Qt::ImCursorRectangle ).toRect();
	const QRect defaultMicroFocus =
		childWidget->QWidget::inputMethodQuery( Qt::ImCursorRectangle ).toRect();
	QRect focusRect = ( microFocus != defaultMicroFocus )
		? QRect( childWidget->mapTo( d->widget, microFocus.topLeft() ), microFocus.size() )
		: QRect( childWidget->mapTo( d->widget, QPoint( 0,0 ) ), childWidget->size() );
	const QRect visibleRect( -d->widget->pos(), d->viewport->size() );

	if( visibleRect.contains( focusRect ) )
		return;

	focusRect.adjust( -xmargin, -ymargin, xmargin, ymargin );

	int posX = 0;
	int posY = 0;

	if( focusRect.width() > visibleRect.width() )
		posX = focusRect.center().x() - d->viewport->width() / 2;
	else if( focusRect.right() > visibleRect.right() )
		posX = focusRect.right() - d->viewport->width();
	else if( focusRect.left() < visibleRect.left() )
		posX = focusRect.left();

	if( focusRect.height() > visibleRect.height() )
		posY = focusRect.center().y() - d->viewport->height() / 2;
	else if( focusRect.bottom() > visibleRect.bottom() )
		posY = focusRect.bottom() - d->viewport->height();
	else if( focusRect.top() < visibleRect.top() )
		posY = focusRect.top();

	setTopLeftPointShownArea( QPoint( posX, posY ) );
}